

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O1

bool __thiscall
aim_t::AimTraverse3DFloors
          (aim_t *this,divline_t *trace,intercept_t *in,int frontflag,int *planestocheck)

{
  double dVar1;
  double dVar2;
  double dVar3;
  line_t *plVar4;
  sector_t *psVar5;
  F3DFloor *pFVar6;
  secplane_t *psVar7;
  secplane_t *psVar8;
  uint uVar9;
  sector_t **ppsVar10;
  extsector_t *peVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  bool bVar15;
  bool bVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  secplane_t *local_88;
  secplane_t *local_80;
  
  plVar4 = (in->d).line;
  *planestocheck = this->aimdir;
  if (plVar4->backsector != (sector_t *)0x0) {
    if (((plVar4->frontsector->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count == 0)
       && ((plVar4->backsector->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count == 0))
    {
      local_80 = (secplane_t *)0x0;
      local_88 = (secplane_t *)0x0;
    }
    else {
      dVar17 = in->frac;
      dVar20 = trace->dx * dVar17 + trace->x;
      dVar21 = trace->dy * dVar17 + trace->y;
      dVar17 = dVar17 * this->attackrange;
      iVar12 = 1;
      local_88 = (secplane_t *)0x0;
      local_80 = (secplane_t *)0x0;
      do {
        ppsVar10 = &plVar4->backsector;
        if (iVar12 == 1) {
          ppsVar10 = &plVar4->frontsector;
        }
        psVar5 = *ppsVar10;
        peVar11 = psVar5->e;
        bVar16 = (peVar11->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count == 0;
        bVar15 = !bVar16;
        if (bVar16) {
          bVar16 = false;
        }
        else {
          iVar14 = iVar12 + -1;
          uVar13 = 0;
          do {
            this->crossedffloors = true;
            pFVar6 = (peVar11->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array[uVar13];
            if ((pFVar6->flags & 0x4000001) == 1) {
              psVar7 = (pFVar6->bottom).plane;
              psVar8 = (pFVar6->top).plane;
              dVar1 = (psVar7->normal).X;
              dVar19 = psVar7->D;
              dVar2 = (psVar7->normal).Y;
              dVar3 = psVar7->negiC;
              dVar18 = c_atan2(((psVar8->normal).Y * dVar21 +
                               (psVar8->normal).X * dVar20 + psVar8->D) * psVar8->negiC -
                               this->shootz,dVar17);
              dVar18 = dVar18 * -57.29577951308232;
              dVar19 = c_atan2((dVar2 * dVar21 + dVar1 * dVar20 + dVar19) * dVar3 - this->shootz,
                               dVar17);
              dVar19 = dVar19 * -57.29577951308232;
              dVar1 = (this->toppitch).Degrees;
              if (dVar18 <= dVar1) {
                if (dVar19 < (this->bottompitch).Degrees) {
                  if ((dVar1 < dVar19) && ((this->toppitch).Degrees = dVar19, iVar14 != frontflag))
                  {
                    local_88 = (pFVar6->bottom).plane;
                    uVar9 = 0xfffffffe;
                    goto LAB_00519c78;
                  }
                  goto LAB_00519c8f;
                }
                bVar16 = false;
              }
              else {
                dVar1 = (this->bottompitch).Degrees;
                if (((dVar1 <= dVar19) && (dVar18 < dVar1)) &&
                   ((this->bottompitch).Degrees = dVar18, iVar14 != frontflag)) {
                  local_80 = (pFVar6->top).plane;
                  uVar9 = 0xfffffffd;
LAB_00519c78:
                  *planestocheck = *planestocheck & uVar9;
                }
LAB_00519c8f:
                if ((iVar14 == frontflag) && (psVar5 == this->lastsector)) {
                  if (((pFVar6->bottom).plane == this->lastceilingplane) &&
                     ((this->toppitch).Degrees <= dVar19 && dVar19 != (this->toppitch).Degrees)) {
                    (this->toppitch).Degrees = dVar19;
                  }
                  if (((pFVar6->top).plane == this->lastfloorplane) &&
                     (dVar18 < (this->bottompitch).Degrees)) {
                    (this->bottompitch).Degrees = dVar18;
                  }
                }
                bVar16 = (this->toppitch).Degrees < (this->bottompitch).Degrees;
              }
              if (!bVar16) {
                bVar16 = true;
                goto LAB_00519d1d;
              }
            }
            uVar13 = uVar13 + 1;
            peVar11 = psVar5->e;
            bVar15 = uVar13 < (peVar11->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
          } while (bVar15);
          bVar16 = false;
        }
LAB_00519d1d:
        if (bVar15) goto LAB_00519d33;
        iVar12 = iVar12 + 1;
      } while (iVar12 != 3);
      bVar16 = false;
LAB_00519d33:
      if (bVar16) {
        return false;
      }
    }
    this->lastsector = (sector_t *)0x0;
    this->lastceilingplane = local_88;
    this->lastfloorplane = local_80;
  }
  return true;
}

Assistant:

bool AimTraverse3DFloors(const divline_t &trace, intercept_t * in, int frontflag, int *planestocheck)
	{
		sector_t * nextsector;
		secplane_t * nexttopplane, *nextbottomplane;
		line_t * li = in->d.line;

		nextsector = NULL;
		nexttopplane = nextbottomplane = NULL;
		*planestocheck = aimdir;

		if (li->backsector == NULL) return true;	// shouldn't really happen but crashed once for me...
		if (li->frontsector->e->XFloor.ffloors.Size() || li->backsector->e->XFloor.ffloors.Size())
		{
			F3DFloor* rover;
			DAngle highpitch, lowpitch;

			double trX = trace.x + trace.dx * in->frac;
			double trY = trace.y + trace.dy * in->frac;
			double dist = attackrange * in->frac;

			// 3D floor check. This is not 100% accurate but normally sufficient when
			// combined with a final sight check
			for (int i = 1; i <= 2; i++)
			{
				sector_t * s = i == 1 ? li->frontsector : li->backsector;

				for (unsigned k = 0; k < s->e->XFloor.ffloors.Size(); k++)
				{
					crossedffloors = true;
					rover = s->e->XFloor.ffloors[k];

					if ((rover->flags & FF_SHOOTTHROUGH) || !(rover->flags & FF_EXISTS)) continue;

					double ff_bottom = rover->bottom.plane->ZatPoint(trX, trY);
					double ff_top = rover->top.plane->ZatPoint(trX, trY);


					highpitch = -VecToAngle(dist, ff_top - shootz);
					lowpitch = -VecToAngle(dist, ff_bottom - shootz);

					if (highpitch <= toppitch)
					{
						// blocks completely
						if (lowpitch >= bottompitch) return false;
						// blocks upper edge of view
						if (lowpitch > toppitch)
						{
							toppitch = lowpitch;
							if (frontflag != i - 1)
							{
								nexttopplane = rover->bottom.plane;
								*planestocheck &= ~aim_up;
							}
						}
					}
					else if (lowpitch >= bottompitch)
					{
						// blocks lower edge of view
						if (highpitch < bottompitch)
						{
							bottompitch = highpitch;
							if (frontflag != i - 1)
							{
								nextbottomplane = rover->top.plane;
								*planestocheck &= ~aim_down;
							}
						}
					}
					// trace is leaving a sector with a 3d-floor

					if (frontflag == i - 1)
					{
						if (s == lastsector)
						{
							// upper slope intersects with this 3d-floor
							if (rover->bottom.plane == lastceilingplane && lowpitch > toppitch)
							{
								toppitch = lowpitch;
							}
							// lower slope intersects with this 3d-floor
							if (rover->top.plane == lastfloorplane && highpitch < bottompitch)
							{
								bottompitch = highpitch;
							}
						}
					}
					if (toppitch >= bottompitch) return false;		// stop
				}
			}
		}

		lastsector = nextsector;
		lastceilingplane = nexttopplane;
		lastfloorplane = nextbottomplane;
		return true;
	}